

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::Export_Material(X3DExporter *this,size_t pIdxMaterial,size_t pTabLevel)

{
  size_t sVar1;
  bool bVar2;
  aiReturn aVar3;
  int iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  allocator<char> local_e09;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  aiVector2t<float> local_dbc;
  allocator<char> local_db1;
  string local_db0;
  allocator<char> local_d89;
  string local_d88;
  aiVector2t<float> local_d64;
  allocator<char> local_d59;
  string local_d58;
  undefined1 local_d34 [8];
  aiUVTransform transform;
  anon_class_16_2_65aab299 Vec2ToAttrList;
  string local_d08;
  allocator<char> local_ce1;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  undefined1 local_c92;
  allocator<char> local_c91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  allocator<char> local_c49;
  value_type local_c48;
  allocator<char> local_c01;
  string local_c00;
  undefined1 local_be0 [8];
  aiString tstring;
  bool tvalb;
  anon_class_8_1_15d7a4cc RepeatToAttrList;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  aiColor3D local_780;
  allocator<char> local_771;
  string local_770;
  aiColor3D local_750;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  aiColor3D local_6f8;
  allocator<char> local_6e9;
  string local_6e8;
  aiColor3D local_6c8;
  allocator<char> local_6b9;
  string local_6b8;
  aiColor3D local_698;
  allocator<char> local_689;
  string local_688;
  aiColor3D local_668;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  undefined1 local_5e8 [8];
  aiColor4D color4;
  aiColor3D color3;
  float tvalf;
  anon_class_16_2_65aab299 Color4ToAttrList;
  string local_5b0;
  allocator<char> local_589;
  value_type local_588;
  undefined1 local_544 [8];
  aiString ai_mat_name;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string material_name;
  string local_d0;
  allocator<char> local_a9;
  value_type local_a8;
  _Self local_68 [3];
  _Self local_50;
  aiMaterial *local_48;
  aiMaterial *material;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  char *NodeName_A;
  size_t pTabLevel_local;
  size_t pIdxMaterial_local;
  X3DExporter *this_local;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = (size_t)anon_var_dwarf_1b7d0b;
  pTabLevel_local = pIdxMaterial;
  pIdxMaterial_local = (size_t)this;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)&material);
  local_48 = this->mScene->mMaterials[pTabLevel_local];
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->mDEF_Map_Material,&pTabLevel_local);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mDEF_Map_Material);
  bVar2 = std::operator!=(&local_50,local_68);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"USE",&local_a9);
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mDEF_Map_Material,&pTabLevel_local);
    std::__cxx11::string::string((string *)&local_a8.Value,(string *)pmVar5);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               *)&material,&local_a8);
    SAttribute::~SAttribute(&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    sVar1 = attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ._M_impl._M_node._M_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,(char *)sVar1,
               (allocator<char> *)(material_name.field_2._M_local_buf + 0xf));
    NodeHelper_OpenNode(this,&local_d0,pTabLevel,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&material);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(material_name.field_2._M_local_buf + 0xf));
    material_name.field_2._8_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"_IDX_",&local_119);
    std::__cxx11::to_string((string *)(ai_mat_name.data + 0x3f8),pTabLevel_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ai_mat_name.data + 0x3f8));
    std::__cxx11::string::~string((string *)(ai_mat_name.data + 0x3f8));
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    aiString::aiString((aiString *)local_544);
    aVar3 = aiMaterial::Get(local_48,"?mat.name",0,0,(aiString *)local_544);
    if (aVar3 == aiReturn_SUCCESS) {
      aiString::C_Str((aiString *)local_544);
      std::__cxx11::string::insert((ulong)local_f8,(char *)0x0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"DEF",&local_589);
    std::__cxx11::string::string((string *)&local_588.Value,(string *)local_f8);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               *)&material,&local_588);
    SAttribute::~SAttribute(&local_588);
    std::allocator<char>::~allocator(&local_589);
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->mDEF_Map_Material,&pTabLevel_local);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)local_f8);
    sVar1 = attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ._M_impl._M_node._M_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b0,(char *)sVar1,
               (allocator<char> *)((long)&Color4ToAttrList.attr_list + 7));
    NodeHelper_OpenNode(this,&local_5b0,pTabLevel,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&material);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&Color4ToAttrList.attr_list + 7));
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                *)&material);
    unique0x10001908 = this;
    Color4ToAttrList.this = (X3DExporter *)&material;
    aiColor3D::aiColor3D((aiColor3D *)&color4.b);
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_5e8);
    aVar3 = aiMaterial::Get(local_48,"$clr.ambient",0,0,(aiColor3D *)&color4.b);
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,"ambientIntensity",&local_609);
      AttrHelper_FloatToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_608,(color4.b + color4.a + color3.r) / 3.0,0.2);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator(&local_609);
    }
    else {
      aVar3 = aiMaterial::Get(local_48,"$clr.ambient",0,0,(aiColor4D *)local_5e8);
      if (aVar3 == aiReturn_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_630,"ambientIntensity",&local_631);
        AttrHelper_FloatToAttrList
                  (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&material,&local_630,
                   ((float)local_5e8._0_4_ + (float)local_5e8._4_4_ + color4.r) / 3.0,0.2);
        std::__cxx11::string::~string((string *)&local_630);
        std::allocator<char>::~allocator(&local_631);
      }
    }
    aVar3 = aiMaterial::Get(local_48,"$clr.diffuse",0,0,(aiColor3D *)&color4.b);
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_658,"diffuseColor",&local_659);
      aiColor3D::aiColor3D(&local_668,0.8,0.8,0.8);
      AttrHelper_Color3ToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_658,(aiColor3D *)&color4.b,&local_668);
      std::__cxx11::string::~string((string *)&local_658);
      std::allocator<char>::~allocator(&local_659);
    }
    else {
      aVar3 = aiMaterial::Get(local_48,"$clr.diffuse",0,0,(aiColor4D *)local_5e8);
      if (aVar3 == aiReturn_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_688,"diffuseColor",&local_689);
        aiColor3D::aiColor3D(&local_698,0.8,0.8,0.8);
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&color3.b,&local_688,(aiColor4D *)local_5e8,
                   &local_698);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
      }
    }
    aVar3 = aiMaterial::Get(local_48,"$clr.emissive",0,0,(aiColor3D *)&color4.b);
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b8,"emissiveColor",&local_6b9);
      aiColor3D::aiColor3D(&local_6c8,0.0,0.0,0.0);
      AttrHelper_Color3ToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_6b8,(aiColor3D *)&color4.b,&local_6c8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator(&local_6b9);
    }
    else {
      aVar3 = aiMaterial::Get(local_48,"$clr.emissive",0,0,(aiColor4D *)local_5e8);
      if (aVar3 == aiReturn_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e8,"emissiveColor",&local_6e9);
        aiColor3D::aiColor3D(&local_6f8,0.0,0.0,0.0);
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&color3.b,&local_6e8,(aiColor4D *)local_5e8,
                   &local_6f8);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
      }
    }
    aVar3 = aiMaterial::Get(local_48,"$mat.shininess",0,0,&color3.g);
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_718,"shininess",&local_719);
      AttrHelper_FloatToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_718,color3.g,0.2);
      std::__cxx11::string::~string((string *)&local_718);
      std::allocator<char>::~allocator(&local_719);
    }
    aVar3 = aiMaterial::Get(local_48,"$clr.specular",0,0,(aiColor3D *)&color4.b);
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_740,"specularColor",&local_741);
      aiColor3D::aiColor3D(&local_750,0.0,0.0,0.0);
      AttrHelper_Color3ToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_740,(aiColor3D *)&color4.b,&local_750);
      std::__cxx11::string::~string((string *)&local_740);
      std::allocator<char>::~allocator(&local_741);
    }
    else {
      aVar3 = aiMaterial::Get(local_48,"$clr.specular",0,0,(aiColor4D *)local_5e8);
      if (aVar3 == aiReturn_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_770,"specularColor",&local_771);
        aiColor3D::aiColor3D(&local_780,0.0,0.0,0.0);
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&color3.b,&local_770,(aiColor4D *)local_5e8,
                   &local_780);
        std::__cxx11::string::~string((string *)&local_770);
        std::allocator<char>::~allocator(&local_771);
      }
    }
    aVar3 = aiMaterial::Get(local_48,"$mat.opacity",0,0,&color3.g);
    if (aVar3 == aiReturn_SUCCESS) {
      if (1.0 < color3.g) {
        color3.g = 1.0;
      }
      color3.g = 1.0 - color3.g;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"transparency",&local_7a1);
      AttrHelper_FloatToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_7a0,color3.g,0.0);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator(&local_7a1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,"Material",
               (allocator<char> *)((long)&RepeatToAttrList.attr_list + 7));
    NodeHelper_OpenNode(this,&local_7c8,pTabLevel + 1,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&material);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&RepeatToAttrList.attr_list + 7));
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                *)&material);
    unique0x10001900 =
         (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
         &material;
    aiString::aiString((aiString *)local_be0);
    aVar3 = aiMaterial::Get(local_48,"$tex.file",1,0,(aiString *)local_be0);
    if (aVar3 == aiReturn_SUCCESS) {
      pcVar6 = aiString::C_Str((aiString *)local_be0);
      iVar4 = strncmp(pcVar6,"*",1);
      if (iVar4 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c00,"Embedded texture is not supported",&local_c01);
        LogError(this,&local_c00);
        std::__cxx11::string::~string((string *)&local_c00);
        std::allocator<char>::~allocator(&local_c01);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"url",&local_c49);
        local_c92 = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c90,"\"",&local_c91);
        pcVar6 = aiString::C_Str((aiString *)local_be0);
        std::operator+(&local_c70,&local_c90,pcVar6);
        std::operator+(&local_c48.Value,&local_c70,"\"");
        local_c92 = 0;
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)&material,&local_c48);
        SAttribute::~SAttribute(&local_c48);
        std::__cxx11::string::~string((string *)&local_c70);
        std::__cxx11::string::~string((string *)&local_c90);
        std::allocator<char>::~allocator(&local_c91);
        std::allocator<char>::~allocator(&local_c49);
      }
    }
    aVar3 = aiMaterial::Get<bool>(local_48,"$tex.mapmodeu",1,0,(bool *)(tstring.data + 0x3fb));
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_cb8,"repeatS",&local_cb9);
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)(tstring.data + 0x3fc),&local_cb8,
                 (bool)(tstring.data[0x3fb] & 1));
      std::__cxx11::string::~string((string *)&local_cb8);
      std::allocator<char>::~allocator(&local_cb9);
    }
    aVar3 = aiMaterial::Get<bool>(local_48,"$tex.mapmodev",1,0,(bool *)(tstring.data + 0x3fb));
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce0,"repeatT",&local_ce1);
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)(tstring.data + 0x3fc),&local_ce0,
                 (bool)(tstring.data[0x3fb] & 1));
      std::__cxx11::string::~string((string *)&local_ce0);
      std::allocator<char>::~allocator(&local_ce1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d08,"ImageTexture",
               (allocator<char> *)((long)&Vec2ToAttrList.attr_list + 7));
    NodeHelper_OpenNode(this,&local_d08,pTabLevel + 1,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&material);
    std::__cxx11::string::~string((string *)&local_d08);
    std::allocator<char>::~allocator((allocator<char> *)((long)&Vec2ToAttrList.attr_list + 7));
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
              ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                *)&material);
    transform._12_8_ = this;
    Vec2ToAttrList.this = (X3DExporter *)&material;
    aiUVTransform::aiUVTransform((aiUVTransform *)local_d34);
    aVar3 = aiMaterial::Get(local_48,"$tex.uvtrafo",1,0,(aiUVTransform *)local_d34);
    if (aVar3 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d58,"translation",&local_d59);
      aiVector2t<float>::aiVector2t(&local_d64,0.0,0.0);
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)&transform.mScaling.y,&local_d58,
                 (aiVector2D *)local_d34,&local_d64);
      std::__cxx11::string::~string((string *)&local_d58);
      std::allocator<char>::~allocator(&local_d59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d88,"rotation",&local_d89)
      ;
      AttrHelper_FloatToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&material,&local_d88,transform.mScaling.x,0.0);
      std::__cxx11::string::~string((string *)&local_d88);
      std::allocator<char>::~allocator(&local_d89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_db0,"scale",&local_db1);
      aiVector2t<float>::aiVector2t(&local_dbc,1.0,1.0);
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)&transform.mScaling.y,&local_db0,
                 &transform.mTranslation,&local_dbc);
      std::__cxx11::string::~string((string *)&local_db0);
      std::allocator<char>::~allocator(&local_db1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_de0,"TextureTransform",&local_de1);
      NodeHelper_OpenNode(this,&local_de0,pTabLevel + 1,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&material);
      std::__cxx11::string::~string((string *)&local_de0);
      std::allocator<char>::~allocator(&local_de1);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::clear
                ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)&material);
    }
    sVar1 = attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ._M_impl._M_node._M_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e08,(char *)sVar1,&local_e09);
    NodeHelper_CloseNode(this,&local_e08,pTabLevel);
    std::__cxx11::string::~string((string *)&local_e08);
    std::allocator<char>::~allocator(&local_e09);
    std::__cxx11::string::~string((string *)local_f8);
    material_name.field_2._8_4_ = 0;
  }
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::~list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)&material);
  return;
}

Assistant:

void X3DExporter::Export_Material(const size_t pIdxMaterial, const size_t pTabLevel)
{
const char* NodeName_A = "Appearance";

list<SAttribute> attr_list;
aiMaterial& material = *mScene->mMaterials[pIdxMaterial];// create alias for conveniance.

	// Check if material already defined early.
	if(mDEF_Map_Material.find(pIdxMaterial) != mDEF_Map_Material.end())
	{
		// Material already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Material.at(pIdxMaterial)});
		NodeHelper_OpenNode(NodeName_A, pTabLevel, true, attr_list);

		return;
	}

	string material_name(string("_IDX_") + to_string(pIdxMaterial));// Create material name
	aiString ai_mat_name;

	if(material.Get(AI_MATKEY_NAME, ai_mat_name) == AI_SUCCESS) material_name.insert(0, ai_mat_name.C_Str());

	// Define material name.
	attr_list.push_back({"DEF", material_name});
	mDEF_Map_Material[pIdxMaterial] = material_name;

	//
	// "Appearance" node.
	//
	NodeHelper_OpenNode(NodeName_A, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Material" node.
	//
	{
		auto Color4ToAttrList = [&](const string& pAttrName, const aiColor4D& pAttrValue, const aiColor3D& pAttrDefaultValue)
		{
			string tstr;

			if(aiColor3D(pAttrValue.r, pAttrValue.g, pAttrValue.b) != pAttrDefaultValue)
			{
				AttrHelper_Col4DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		float tvalf;
		aiColor3D color3;
		aiColor4D color4;

		// ambientIntensity="0.2"     SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_AMBIENT, color3) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color3.r + color3.g + color3.b) / 3.0f, 0.2f);
		else if(material.Get(AI_MATKEY_COLOR_AMBIENT, color4) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color4.r + color4.g + color4.b) / 3.0f, 0.2f);

		// diffuseColor="0.8 0.8 0.8" SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "diffuseColor", color3, aiColor3D(0.8f, 0.8f, 0.8f));
		else if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color4) == AI_SUCCESS)
			Color4ToAttrList("diffuseColor", color4, aiColor3D(0.8f, 0.8f, 0.8f));

		// emissiveColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "emissiveColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color4) == AI_SUCCESS)
			Color4ToAttrList("emissiveColor", color4, aiColor3D(0, 0, 0));

		// shininess="0.2"            SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_SHININESS, tvalf) == AI_SUCCESS) AttrHelper_FloatToAttrList(attr_list, "shininess", tvalf, 0.2f);

		// specularColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_SPECULAR, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "specularColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_SPECULAR, color4) == AI_SUCCESS)
			Color4ToAttrList("specularColor", color4, aiColor3D(0, 0, 0));

		// transparency="0"           SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_OPACITY, tvalf) == AI_SUCCESS)
		{
			if(tvalf > 1) tvalf = 1;

			tvalf = 1.0f - tvalf;
			AttrHelper_FloatToAttrList(attr_list, "transparency", tvalf, 0);
		}

		NodeHelper_OpenNode("Material", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "Material" node. END.

	//
	// "ImageTexture" node.
	//
	{
		auto RepeatToAttrList = [&](const string& pAttrName, const bool pAttrValue)
		{
			if(!pAttrValue) attr_list.push_back({pAttrName, "false"});
		};

		bool tvalb;
		aiString tstring;

		// url=""         MFString
		if(material.Get(AI_MATKEY_TEXTURE_DIFFUSE(0), tstring) == AI_SUCCESS)
		{
			if(strncmp(tstring.C_Str(), AI_EMBEDDED_TEXNAME_PREFIX, strlen(AI_EMBEDDED_TEXNAME_PREFIX)) == 0)
				LogError("Embedded texture is not supported");
			else
				attr_list.push_back({"url", string("\"") + tstring.C_Str() + "\""});
		}

		// repeatS="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatS", tvalb);

		// repeatT="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatT", tvalb);

		NodeHelper_OpenNode("ImageTexture", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "ImageTexture" node. END.

	//
	// "TextureTransform" node.
	//
	{
		auto Vec2ToAttrList = [&](const string& pAttrName, const aiVector2D& pAttrValue, const aiVector2D& pAttrDefaultValue)
		{
			string tstr;

			if(pAttrValue != pAttrDefaultValue)
			{
				AttrHelper_Vec2DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		aiUVTransform transform;

		if(material.Get(AI_MATKEY_UVTRANSFORM_DIFFUSE(0), transform) == AI_SUCCESS)
		{
			Vec2ToAttrList("translation", transform.mTranslation, aiVector2D(0, 0));
			AttrHelper_FloatToAttrList(attr_list, "rotation", transform.mRotation, 0);
			Vec2ToAttrList("scale", transform.mScaling, aiVector2D(1, 1));

			NodeHelper_OpenNode("TextureTransform", pTabLevel + 1, true, attr_list);
			attr_list.clear();
		}
	}// "TextureTransform" node. END.

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_A, pTabLevel);

}